

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Regexp * __thiscall re2::Regexp::Incref(Regexp *this)

{
  mapped_type *pmVar1;
  Regexp *in_RDI;
  MutexLock l;
  Mutex *in_stack_ffffffffffffffa8;
  MutexLock *in_stack_ffffffffffffffb0;
  anon_class_1_0_00000001 *in_stack_ffffffffffffffc8;
  once_flag *in_stack_ffffffffffffffd0;
  key_type *in_stack_ffffffffffffffe8;
  Regexp *this_00;
  
  if (in_RDI->ref_ < 0xfffe) {
    in_RDI->ref_ = in_RDI->ref_ + 1;
  }
  else {
    this_00 = in_RDI;
    std::call_once<re2::Regexp::Incref()::__0>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    MutexLock::MutexLock(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (in_RDI->ref_ == 0xffff) {
      pmVar1 = std::
               map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
               ::operator[]((map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
                             *)this_00,in_stack_ffffffffffffffe8);
      *pmVar1 = *pmVar1 + 1;
    }
    else {
      pmVar1 = std::
               map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
               ::operator[]((map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
                             *)this_00,in_stack_ffffffffffffffe8);
      *pmVar1 = 0xffff;
      in_RDI->ref_ = 0xffff;
    }
    MutexLock::~MutexLock((MutexLock *)0x227158);
  }
  return in_RDI;
}

Assistant:

Regexp* Regexp::Incref() {
  if (ref_ >= kMaxRef-1) {
    static std::once_flag ref_once;
    std::call_once(ref_once, []() {
      ref_mutex = new Mutex;
      ref_map = new std::map<Regexp*, int>;
    });

    // Store ref count in overflow map.
    MutexLock l(ref_mutex);
    if (ref_ == kMaxRef) {
      // already overflowed
      (*ref_map)[this]++;
    } else {
      // overflowing now
      (*ref_map)[this] = kMaxRef;
      ref_ = kMaxRef;
    }
    return this;
  }

  ref_++;
  return this;
}